

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_append_ctx(void)

{
  int iVar1;
  int __fd;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint32_t uVar5;
  char *pcVar6;
  uint uVar7;
  bson_t bcon;
  bson_t expected;
  bson_t child;
  bson_t local_280;
  undefined1 local_200 [4];
  uint local_1fc;
  undefined1 local_180 [336];
  
  bson_init(&local_280);
  bson_init(local_200);
  bson_init(local_180);
  bson_append_utf8(local_180,"c",0xffffffff,"d",0xffffffff);
  bson_append_utf8(local_180,"e",0xffffffff,"f",0xffffffff);
  bson_append_document(local_200,"a",0xffffffff,local_180);
  test_append_ctx_helper(&local_280,"a","{",0,"add magic","e","f","}",0);
  __buf = (void *)bson_get_data(&local_280);
  __buf_00 = (void *)bson_get_data(local_200);
  if (local_1fc == local_280.len) {
    __s1 = (void *)bson_get_data(local_200);
    __s2 = (void *)bson_get_data(&local_280);
    iVar1 = bcmp(__s1,__s2,(ulong)local_1fc);
    if (iVar1 == 0) {
      bson_destroy(&local_280);
      bson_destroy(local_200);
      bson_destroy(local_180);
      return;
    }
  }
  uVar2 = bson_as_canonical_extended_json(&local_280,0);
  uVar3 = bson_as_canonical_extended_json(local_200,0);
  uVar7 = 0;
  uVar5 = local_1fc;
  if (local_280.len < local_1fc) {
    uVar7 = 0;
    uVar5 = local_280.len;
  }
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    if (*(char *)((long)__buf + (ulong)uVar7) != *(char *)((long)__buf_00 + (ulong)uVar7))
    goto LAB_001336eb;
  }
  uVar7 = local_280.len;
  if (local_280.len < local_1fc) {
    uVar7 = local_1fc;
  }
  uVar7 = uVar7 - 1;
LAB_001336eb:
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar7,uVar2,uVar3);
  iVar1 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar1 == -1) {
    pcVar6 = "fd1 != -1";
  }
  else if (__fd == -1) {
    pcVar6 = "fd2 != -1";
  }
  else {
    uVar4 = write(iVar1,__buf,(ulong)local_280.len);
    if (uVar4 == local_280.len) {
      uVar4 = write(__fd,__buf_00,(ulong)local_1fc);
      if (uVar4 == local_1fc) {
        close(iVar1);
        close(__fd);
        pcVar6 = "0";
      }
      else {
        pcVar6 = "(&expected)->len == bson_write (fd2, expected_data, (&expected)->len)";
      }
    }
    else {
      pcVar6 = "(&bcon)->len == bson_write (fd1, bson_data, (&bcon)->len)";
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
          ,0x271,"test_append_ctx",pcVar6);
  abort();
}

Assistant:

static void
test_append_ctx (void)
{
   bson_t bcon, expected, child;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);

   bson_append_utf8 (&child, "c", -1, "d", -1);
   bson_append_utf8 (&child, "e", -1, "f", -1);

   bson_append_document (&expected, "a", -1, &child);

   test_append_ctx_helper (
      &bcon, "a", "{", NULL, "add magic", "e", "f", "}", NULL);

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
   bson_destroy (&child);
}